

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppPrinter.cpp
# Opt level: O2

void __thiscall hdc::CppPrinter::generatePrototype(CppPrinter *this,Def *def)

{
  Type *pTVar1;
  ostream *poVar2;
  string sStack_48;
  
  pTVar1 = Def::getReturnType(def);
  (**(pTVar1->super_ASTNode)._vptr_ASTNode)(pTVar1,this);
  poVar2 = std::operator<<((ostream *)&this->field_0x20," ");
  Def::getUniqueCppName_abi_cxx11_(&sStack_48,def);
  poVar2 = std::operator<<(poVar2,(string *)&sStack_48);
  std::operator<<(poVar2,"(");
  std::__cxx11::string::~string((string *)&sStack_48);
  generateDefParameters(this,def);
  std::operator<<((ostream *)&this->field_0x20,");\n");
  return;
}

Assistant:

void CppPrinter::generatePrototype(Def* def) {
    def->getReturnType()->accept(this);
    output << " " << def->getUniqueCppName() << "(";

    generateDefParameters(def);
    output << ");\n";
}